

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Decla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_3c;
  uint local_38;
  int fVerbose;
  int fBooth;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_38 = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"bvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Decla(): There is no AIG.\n");
        }
        else {
          pNew = Acec_ManDecla(pAbc->pGia,local_38,local_3c);
          Abc_FrameUpdateGia(pAbc,pNew);
        }
        return 0;
      }
      if (iVar1 != 0x62) break;
      local_38 = local_38 ^ 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_3c = local_3c ^ 1;
  }
  Abc_Print(-2,"usage: &decla [-bvh]\n");
  Abc_Print(-2,"\t         removes carry look ahead adders\n");
  pcVar2 = "no";
  if (local_38 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-b     : toggles working with Booth multipliers [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Decla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fBooth = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBooth ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Decla(): There is no AIG.\n" );
        return 0;
    }
    pTemp = Acec_ManDecla( pAbc->pGia, fBooth, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &decla [-bvh]\n" );
    Abc_Print( -2, "\t         removes carry look ahead adders\n" );
    Abc_Print( -2, "\t-b     : toggles working with Booth multipliers [default = %s]\n",  fBooth? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}